

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::reporters::Reporter_testLoggingReporter_Test::~Reporter_testLoggingReporter_Test
          (Reporter_testLoggingReporter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Reporter, testLoggingReporter)
{
    const auto logger = logging::nullLogger();
    LoggingReporter reporter(*logger);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    reporter.close();
}